

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3VdbeSorterReset(sqlite3 *db,VdbeSorter *pSorter)

{
  ulong uVar1;
  SorterFile *pSVar2;
  
  vdbeSorterJoinAll(pSorter,0);
  if (pSorter->pReader != (PmaReader *)0x0) {
    vdbePmaReaderClear(pSorter->pReader);
    sqlite3DbFree(db,pSorter->pReader);
    pSorter->pReader = (PmaReader *)0x0;
  }
  vdbeMergeEngineFree(pSorter->pMerger);
  pSorter->pMerger = (MergeEngine *)0x0;
  pSVar2 = &pSorter->aTask[0].file2;
  for (uVar1 = 0; uVar1 < pSorter->nTask; uVar1 = uVar1 + 1) {
    sqlite3DbFree(db,*(UnpackedRecord **)((long)(pSVar2 + -4) + 8));
    if (((SorterList *)(pSVar2 + -3))->aMemory == (u8 *)0x0) {
      vdbeSorterRecordFree((sqlite3 *)0x0,((SorterList *)(pSVar2 + -3))->pList);
    }
    else {
      sqlite3_free(((SorterList *)(pSVar2 + -3))->aMemory);
    }
    if (pSVar2[-1].pFd != (sqlite3_file *)0x0) {
      sqlite3OsCloseFree(pSVar2[-1].pFd);
    }
    if (pSVar2->pFd != (sqlite3_file *)0x0) {
      sqlite3OsCloseFree(pSVar2->pFd);
    }
    pSVar2->pFd = (sqlite3_file *)0x0;
    pSVar2->iEof = 0;
    pSVar2[-1].pFd = (sqlite3_file *)0x0;
    pSVar2[-1].iEof = 0;
    *(i64 *)(pSVar2 + -2) = 0;
    *(undefined8 *)((long)(pSVar2 + -2) + 8) = 0;
    ((SorterList *)(pSVar2 + -3))->pList = (SorterRecord *)0x0;
    ((SorterList *)(pSVar2 + -3))->aMemory = (u8 *)0x0;
    *(VdbeSorter **)(pSVar2 + -4) = (VdbeSorter *)0x0;
    *(UnpackedRecord **)((long)(pSVar2 + -4) + 8) = (UnpackedRecord *)0x0;
    ((SortSubtask *)(pSVar2 + -5))->pThread = (SQLiteThread *)0x0;
    *(int *)&pSVar2[-5].iEof = 0;
    *(int *)((long)&pSVar2[-5].iEof + 4) = 0;
    *(VdbeSorter **)(pSVar2 + -4) = pSorter;
    pSVar2 = pSVar2 + 6;
  }
  if ((pSorter->list).aMemory == (u8 *)0x0) {
    vdbeSorterRecordFree((sqlite3 *)0x0,(pSorter->list).pList);
  }
  (pSorter->list).pList = (SorterRecord *)0x0;
  (pSorter->list).szPMA = 0;
  pSorter->bUsePMA = '\0';
  pSorter->iMemory = 0;
  pSorter->mxKeysize = 0;
  sqlite3DbFree(db,pSorter->pUnpacked);
  pSorter->pUnpacked = (UnpackedRecord *)0x0;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeSorterReset(sqlite3 *db, VdbeSorter *pSorter){
  int i;
  (void)vdbeSorterJoinAll(pSorter, SQLITE_OK);
  assert( pSorter->bUseThreads || pSorter->pReader==0 );
#if SQLITE_MAX_WORKER_THREADS>0
  if( pSorter->pReader ){
    vdbePmaReaderClear(pSorter->pReader);
    sqlite3DbFree(db, pSorter->pReader);
    pSorter->pReader = 0;
  }
#endif
  vdbeMergeEngineFree(pSorter->pMerger);
  pSorter->pMerger = 0;
  for(i=0; i<pSorter->nTask; i++){
    SortSubtask *pTask = &pSorter->aTask[i];
    vdbeSortSubtaskCleanup(db, pTask);
    pTask->pSorter = pSorter;
  }
  if( pSorter->list.aMemory==0 ){
    vdbeSorterRecordFree(0, pSorter->list.pList);
  }
  pSorter->list.pList = 0;
  pSorter->list.szPMA = 0;
  pSorter->bUsePMA = 0;
  pSorter->iMemory = 0;
  pSorter->mxKeysize = 0;
  sqlite3DbFree(db, pSorter->pUnpacked);
  pSorter->pUnpacked = 0;
}